

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ostream * __thiscall
parser::ActionState::stringify(ActionState *this,ostream *out,NonTerminalNames *nonTerminalNames)

{
  ostream *poVar1;
  ParserError *this_00;
  allocator<char> local_49;
  string local_48;
  
  poVar1 = std::operator<<(out,"[");
  if (3 < (ulong)this->action) {
    this_00 = (ParserError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"invalid action",&local_49);
    ParserError::ParserError(this_00,&local_48);
    __cxa_throw(this_00,&ParserError::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = std::operator<<(poVar1,&DAT_001283c4 + *(int *)(&DAT_001283c4 + (ulong)this->action * 4))
  ;
  poVar1 = std::operator<<(poVar1,", ");
  std::ostream::operator<<((ostream *)poVar1,this->state);
  if (this->nonTerminal != 0) {
    poVar1 = std::operator<<(out,", ");
    nonTerminalName(&local_48,this->nonTerminal,nonTerminalNames);
    poVar1 = std::operator<<(poVar1,(string *)&local_48);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"]");
    std::__cxx11::string::~string((string *)&local_48);
    return poVar1;
  }
  poVar1 = std::operator<<(out,"]");
  return poVar1;
}

Assistant:

std::ostream& stringify(std::ostream& out, NonTerminalNames const& nonTerminalNames) const {
            out << "[" << (action == Shift ? "S" : action == Reduce ? "R" : action == Accept ? "A" : action == Error ? "E" : throw ParserError("invalid action"))
                << ", " << state;
            if (nonTerminal == Invalid)
                return out << "]";
            return out << ", "
                       << nonTerminalName(nonTerminal, nonTerminalNames) << ", "
                       << reduceCount  << "]";
        }